

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O2

void ImVector_ImFontConfig_resize(ImVector_ImFontConfig *self,int new_size)

{
  int iVar1;
  
  iVar1 = self->Capacity;
  if (iVar1 < new_size) {
    if (iVar1 == 0) {
      iVar1 = 8;
    }
    else {
      iVar1 = iVar1 / 2 + iVar1;
    }
    if (iVar1 <= new_size) {
      iVar1 = new_size;
    }
    ImVector<ImFontConfig>::reserve(self,iVar1);
  }
  self->Size = new_size;
  return;
}

Assistant:

CIMGUI_API void ImVector_ImFontConfig_resize(ImVector_ImFontConfig* self,int new_size)
{
    return self->resize(new_size);
}